

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__instance_camera
          (NodeLoader *this,instance_camera__AttributeData *attributeData)

{
  Node *pNVar1;
  _Elt_pointer ppNVar2;
  UniqueId *pUVar3;
  UniqueId instantiatedCameraUniqueId;
  UniqueId instanceCameraUniqueId;
  InstanceCamera *instanceCamera;
  UniqueId local_48;
  UniqueId local_30;
  InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)430> *local_18;
  
  ppNVar2 = (this->mNodeStack).c.
            super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppNVar2 ==
      (this->mNodeStack).c.super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppNVar2 = (this->mNodeStack).c.
              super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pNVar1 = ppNVar2[-1];
  pUVar3 = IFilePartLoader::createUniqueIdFromUrl
                     (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->
                       super_IFilePartLoader,&attributeData->url,CAMERA,false);
  local_48.mClassId = pUVar3->mClassId;
  local_48._4_4_ = *(undefined4 *)&pUVar3->field_0x4;
  local_48.mObjectId = pUVar3->mObjectId;
  local_48.mFileId = pUVar3->mFileId;
  IFilePartLoader::createUniqueId
            (&local_30,
             &((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader,
             INSTANCE_CAMERA);
  local_18 = (InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)430> *)operator_new(0x58);
  (local_18->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)430>).mUniqueId.mFileId =
       local_30.mFileId;
  (local_18->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)430>).mUniqueId.mClassId =
       local_30.mClassId;
  *(undefined4 *)
   &(local_18->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)430>).mUniqueId.field_0x4 =
       local_30._4_4_;
  (local_18->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)430>).mUniqueId.mObjectId =
       local_30.mObjectId;
  (local_18->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)430>).super_Object._vptr_Object
       = (_func_int **)&PTR__InstanceBase_009b03b0;
  (local_18->mName)._M_dataplus._M_p = (pointer)&(local_18->mName).field_2;
  (local_18->mName)._M_string_length = 0;
  (local_18->mName).field_2._M_local_buf[0] = '\0';
  (local_18->mInstanciatedObjectId).mClassId = local_48.mClassId;
  *(undefined4 *)&(local_18->mInstanciatedObjectId).field_0x4 = local_48._4_4_;
  (local_18->mInstanciatedObjectId).mObjectId = local_48.mObjectId;
  (local_18->mInstanciatedObjectId).mFileId = local_48.mFileId;
  COLLADAFW::ArrayPrimitiveType<COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)430>_*>::
  append(&(pNVar1->mInstanceCameras).
          super_ArrayPrimitiveType<COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)430>_*>
         ,&local_18);
  COLLADAFW::UniqueId::~UniqueId(&local_30);
  COLLADAFW::UniqueId::~UniqueId(&local_48);
  return true;
}

Assistant:

bool NodeLoader::begin__instance_camera( const instance_camera__AttributeData& attributeData )
	{
        COLLADAFW::Node* currentNode = mNodeStack.top();
		COLLADAFW::UniqueId instantiatedCameraUniqueId = getHandlingFilePartLoader()->createUniqueIdFromUrl( attributeData.url, COLLADAFW::Camera::ID() );

        COLLADAFW::UniqueId instanceCameraUniqueId = getHandlingFilePartLoader()->createUniqueId( COLLADAFW::InstanceCamera::ID() );
		COLLADAFW::InstanceCamera* instanceCamera = FW_NEW COLLADAFW::InstanceCamera(instanceCameraUniqueId, instantiatedCameraUniqueId);
		currentNode->getInstanceCameras().append(instanceCamera);

		return true;
	}